

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O0

bool __thiscall
glslang::HlslGrammar::acceptStreamOutTemplateType
          (HlslGrammar *this,TType *type,TLayoutGeometry *geometry)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TLayoutGeometry *geometry_local;
  TType *type_local;
  HlslGrammar *this_local;
  
  *geometry = ElgNone;
  bVar1 = acceptOutputPrimitiveGeometry(this,geometry);
  if (bVar1) {
    bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
    if (bVar1) {
      bVar1 = acceptType(this,type);
      if (bVar1) {
        iVar2 = (*type->_vptr_TType[10])();
        *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) =
             *(ulong *)(CONCAT44(extraout_var,iVar2) + 8) & 0xffffffffffffff80 | 0x11;
        iVar2 = (*type->_vptr_TType[10])();
        *(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) =
             *(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) & 0xffffffffffff007f | 0x4980;
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          expected(this,"right angle bracket");
          this_local._7_1_ = false;
        }
      }
      else {
        expected(this,"stream output type");
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HlslGrammar::acceptStreamOutTemplateType(TType& type, TLayoutGeometry& geometry)
{
    geometry = ElgNone;

    if (! acceptOutputPrimitiveGeometry(geometry))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle))
        return false;

    if (! acceptType(type)) {
        expected("stream output type");
        return false;
    }

    type.getQualifier().storage = EvqOut;
    type.getQualifier().builtIn = EbvGsOutputStream;

    if (! acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    return true;
}